

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O2

void polyscope::saveImage(string *name,uchar *buffer,int w,int h,int channels)

{
  bool bVar1;
  allocator local_fa;
  allocator local_f9;
  uchar *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_f8 = buffer;
  stbi_flip_vertically_on_write(1);
  stbi_write_png_compression_level = 0;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  std::__cxx11::string::string((string *)&local_70,".png",&local_fa);
  bVar1 = anon_unknown_5::hasExtension(&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
LAB_001d452d:
    stbi_write_png((name->_M_dataplus)._M_p,w,h,channels,local_f8,channels * w);
  }
  else {
    std::__cxx11::string::string((string *)&local_90,(string *)name);
    std::__cxx11::string::string((string *)&local_f0,".jpg",&local_fa);
    bVar1 = anon_unknown_5::hasExtension(&local_90,&local_f0);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,(string *)name);
      std::__cxx11::string::string((string *)&local_d0,"jpeg",&local_f9);
      bVar1 = anon_unknown_5::hasExtension(&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar1) goto LAB_001d452d;
    }
    stbi_write_jpg((name->_M_dataplus)._M_p,w,h,channels,local_f8,100);
  }
  return;
}

Assistant:

void saveImage(std::string name, unsigned char* buffer, int w, int h, int channels) {

  // our buffers are from openGL, so they are flipped
  stbi_flip_vertically_on_write(1);
  stbi_write_png_compression_level = 0;

  // Auto-detect filename
  if (hasExtension(name, ".png")) {
    stbi_write_png(name.c_str(), w, h, channels, buffer, channels * w);
  } else if (hasExtension(name, ".jpg") || hasExtension(name, "jpeg")) {
    stbi_write_jpg(name.c_str(), w, h, channels, buffer, 100);

    // TGA seems to display different on different machines: our fault or theirs?
    // Both BMP and TGA need alpha channel stripped? bmp doesn't seem to work even with this
    /*
    } else if (hasExtension(name, ".tga")) {
     stbi_write_tga(name.c_str(), w, h, channels, buffer);
    } else if (hasExtension(name, ".bmp")) {
     stbi_write_bmp(name.c_str(), w, h, channels, buffer);
    */

  } else {
    // Fall back on png
    stbi_write_png(name.c_str(), w, h, channels, buffer, channels * w);
  }
}